

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_io.cc
# Opt level: O3

int __thiscall comp_io_buf::open_file(comp_io_buf *this,char *name,bool stdin_off,int flag)

{
  iterator __position;
  int iVar1;
  char *pcVar2;
  long lVar3;
  int ret;
  int local_14;
  gzFile_s *local_10;
  
  local_10 = (gzFile_s *)0x0;
  local_14 = -1;
  if (flag == 2) {
    pcVar2 = "wb";
  }
  else {
    if (flag != 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Unknown file operation. Something other than READ/WRITE specified",0x41);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      return local_14;
    }
    if (*name == '\0') {
      if (stdin_off) {
        return -1;
      }
      iVar1 = fileno(_stdin);
      local_10 = (gzFile_s *)gzdopen(iVar1,"rb");
      goto LAB_002006cf;
    }
    pcVar2 = "rb";
  }
  local_10 = (gzFile_s *)gzopen64(name,pcVar2);
LAB_002006cf:
  if (local_10 != (gzFile_s *)0x0) {
    __position._M_current = *(gzFile_s ***)&this->field_0xb0;
    if (__position._M_current == *(gzFile_s ***)&this->field_0xb8) {
      std::vector<gzFile_s*,std::allocator<gzFile_s*>>::_M_realloc_insert<gzFile_s*const&>
                ((vector<gzFile_s*,std::allocator<gzFile_s*>> *)&this->gz_files,__position,&local_10
                );
      lVar3 = *(long *)&this->field_0xb0;
    }
    else {
      *__position._M_current = local_10;
      lVar3 = *(long *)&this->field_0xb0 + 8;
      *(long *)&this->field_0xb0 = lVar3;
    }
    local_14 = (int)((ulong)(lVar3 - *(long *)&this->gz_files) >> 3) + -1;
    v_array<int>::push_back(&(this->super_io_buf).files,&local_14);
  }
  return local_14;
}

Assistant:

int comp_io_buf::open_file(const char* name, bool stdin_off, int flag)
{
  gzFile fil = nullptr;
  int ret = -1;
  switch (flag)
  {
    case READ:
      if (*name != '\0')
        fil = gzopen(name, "rb");
      else if (!stdin_off)
#ifdef _WIN32
        fil = gzdopen(_fileno(stdin), "rb");
#else
        fil = gzdopen(fileno(stdin), "rb");
#endif
      if (fil != nullptr)
      {
        gz_files.push_back(fil);
        ret = (int)gz_files.size() - 1;
        files.push_back(ret);
      }
      break;

    case WRITE:
      fil = gzopen(name, "wb");
      if (fil != nullptr)
      {
        gz_files.push_back(fil);
        ret = (int)gz_files.size() - 1;
        files.push_back(ret);
      }
      break;

    default:
      std::cerr << "Unknown file operation. Something other than READ/WRITE specified" << std::endl;
  }
  return ret;
}